

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::timer_type::timer_type(timer_type *this)

{
  timer_type *this_local;
  
  timer_object<timertt::thread_safety::safe>::timer_object
            (&this->super_timer_object<timertt::thread_safety::safe>);
  (this->super_timer_object<timertt::thread_safety::safe>)._vptr_timer_object =
       (_func_int **)&PTR__timer_type_005c0868;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_when);
  std::function<void_()>::function(&this->m_action);
  this->m_prev = (timer_type *)0x0;
  this->m_next = (timer_type *)0x0;
  std::atomic<timertt::details::timer_status>::operator=
            ((atomic<timertt::details::timer_status> *)
             &(this->super_timer_object<timertt::thread_safety::safe>).field_0xc,deactivated);
  return;
}

Assistant:

timer_type()
		{
			m_status = timer_status::deactivated;
		}